

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

void cppcms::xss::anon_unknown_8::parse_part(entry *part)

{
  pointer *pppVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  pointer ppVar6;
  char *pcVar7;
  char **ppcVar8;
  bool bVar9;
  pointer ppVar10;
  pointer ppVar11;
  pointer ppVar12;
  ulong uVar13;
  char *p;
  byte *pbVar14;
  uint uVar15;
  int __base;
  pointer ppVar16;
  ulong uVar17;
  byte *pbVar18;
  pointer ppVar19;
  pointer ppVar20;
  char *p_2;
  pointer ppVar21;
  byte *pbVar22;
  ulong uVar23;
  pointer local_58;
  pointer local_50;
  ulong local_48;
  pointer local_40;
  pointer local_38;
  
  if (part->type == html_tag) {
    pcVar4 = part->begin;
    pcVar5 = part->end;
    ppVar21 = (pointer)(pcVar4 + 1);
    ppVar19 = (pointer)(pcVar5 + -1);
    if (ppVar21 < ppVar19) {
      bVar3 = *(byte *)&ppVar21->property_begin;
      if (bVar3 == 0x2f) {
        if ((pcVar4[2] == 0x5f) || ((byte)((pcVar4[2] & 0xdfU) + 0xbf) < 0x1a)) {
          ppVar21 = (pointer)(pcVar4 + 3);
          while ((ppVar12 = ppVar21, ppVar21 != ppVar19 &&
                 (bVar9 = ascii_isalnum(*(char *)&ppVar21->property_begin), bVar9))) {
            ppVar21 = (pointer)((long)&ppVar21->property_begin + 1);
          }
          while (((ulong)*(byte *)&ppVar12->property_begin < 0x21 &&
                 ((0x100002600U >> ((ulong)*(byte *)&ppVar12->property_begin & 0x3f) & 1) != 0))) {
            ppVar12 = (pointer)((long)&ppVar12->property_begin + 1);
          }
          if (ppVar12 == ppVar19) {
            (part->tag).tag_begin = pcVar4 + 2;
            (part->tag).tag_end = (char *)ppVar21;
            part->type = close_tag;
            return;
          }
        }
      }
      else if ((bVar3 == 0x5f) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) {
        (part->tag).tag_begin = (char *)ppVar21;
        do {
          ppcVar8 = &ppVar21->property_begin;
          ppVar21 = (pointer)((long)&ppVar21->property_begin + 1);
          bVar9 = ascii_isalnum(*(char *)((long)ppcVar8 + 1));
        } while (bVar9);
        (part->tag).tag_end = (char *)ppVar21;
        if (pcVar5[-2] == '/') {
          ppVar19 = (pointer)(pcVar5 + -2);
        }
        part->type = (uint)(pcVar5[-2] == '/') * 2 + open_tag;
        bVar9 = true;
        local_38 = ppVar19;
        while( true ) {
          do {
            while( true ) {
              if (ppVar19 <= ppVar21) {
                return;
              }
              bVar3 = *(byte *)&ppVar21->property_begin;
              if ((0x20 < (ulong)bVar3) || ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
              break;
              bVar9 = true;
              ppVar21 = (pointer)((long)&ppVar21->property_begin + 1);
            }
            if ((!bVar9) ||
               ((ppVar12 = ppVar21, bVar3 != 0x5f && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf)))))
            goto LAB_00246c87;
            do {
              ppVar11 = ppVar12;
              bVar9 = ascii_isalnum(*(char *)&ppVar11->property_begin);
              ppVar12 = (pointer)((long)&ppVar11->property_begin + 1);
            } while (bVar9);
            ppVar6 = (part->tag).properties.
                     super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            ppVar16 = ppVar11;
            if (ppVar6 == (part->tag).properties.
                          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ppVar19 = (part->tag).properties.
                        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((long)ppVar6 - (long)ppVar19 == 0x7fffffffffffffe0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar23 = (long)ppVar6 - (long)ppVar19 >> 5;
              uVar13 = uVar23;
              if (ppVar6 == ppVar19) {
                uVar13 = 1;
              }
              uVar17 = uVar13 + uVar23;
              if (0x3fffffffffffffe < uVar17) {
                uVar17 = 0x3ffffffffffffff;
              }
              if (CARRY8(uVar13,uVar23)) {
                uVar17 = 0x3ffffffffffffff;
              }
              if (uVar17 == 0) {
                ppVar10 = (pointer)0x0;
              }
              else {
                local_50 = ppVar11;
                local_48 = uVar17;
                local_40 = ppVar19;
                ppVar10 = (pointer)operator_new(uVar17 << 5);
                ppVar16 = local_50;
                uVar17 = local_48;
                ppVar19 = local_40;
              }
              ppVar10[uVar23].property_begin = (char *)ppVar21;
              ppVar10[uVar23].property_end = (char *)ppVar16;
              ppVar10[uVar23].value_begin = (char *)0x0;
              (&ppVar10[uVar23].value_begin)[1] = (char *)0x0;
              ppVar21 = ppVar10;
              for (ppVar20 = ppVar19; ppVar20 != ppVar6; ppVar20 = ppVar20 + 1) {
                pcVar4 = ppVar20->property_begin;
                pcVar5 = ppVar20->property_end;
                pcVar7 = ppVar20->value_end;
                ppVar21->value_begin = ppVar20->value_begin;
                ppVar21->value_end = pcVar7;
                ppVar21->property_begin = pcVar4;
                ppVar21->property_end = pcVar5;
                ppVar21 = ppVar21 + 1;
              }
              if (ppVar19 != (pointer)0x0) {
                local_50 = ppVar10;
                operator_delete(ppVar19);
                ppVar10 = local_50;
              }
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_start = ppVar10;
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar21 + 1;
              (part->tag).properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar10 + uVar17;
              ppVar19 = local_38;
            }
            else {
              ppVar6->property_begin = (char *)ppVar21;
              ppVar6->property_end = (char *)ppVar11;
              ppVar6->value_begin = (char *)0x0;
              ppVar6->value_end = (char *)0x0;
              pppVar1 = &(part->tag).properties.
                         super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
            uVar13 = (ulong)*(byte *)&ppVar16->property_begin;
            if (0x3d < uVar13) goto LAB_00246c87;
            bVar9 = true;
            ppVar21 = ppVar12;
          } while ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0);
          if ((uVar13 != 0x3d) ||
             ((cVar2 = *(char *)&ppVar12->property_begin, cVar2 != '\'' && (cVar2 != '\"')))) break;
          ppVar12 = (pointer)((long)&ppVar11->property_begin + 2);
          for (ppVar21 = ppVar12;
              (ppVar21 < ppVar19 && (*(char *)&ppVar21->property_begin != cVar2));
              ppVar21 = (pointer)((long)&ppVar21->property_begin + 1)) {
          }
          ppVar11 = ppVar12;
          if (ppVar21 == ppVar19) break;
          while (ppVar21 != ppVar11) {
            cVar2 = *(char *)&ppVar11->property_begin;
            if (cVar2 == '&') {
              local_58 = (pointer)((long)&ppVar11->property_begin + 1);
              bVar9 = ends_with((char **)&local_58,(char *)ppVar21,"amp;");
              ppVar11 = local_58;
              if ((((!bVar9) &&
                   (bVar9 = ends_with((char **)&local_58,(char *)ppVar21,"lt;"), ppVar11 = local_58,
                   !bVar9)) &&
                  (bVar9 = ends_with((char **)&local_58,(char *)ppVar21,"gt;"), ppVar11 = local_58,
                  !bVar9)) &&
                 (((bVar9 = ends_with((char **)&local_58,(char *)ppVar21,"quot;"),
                   ppVar11 = local_58, !bVar9 &&
                   (bVar9 = ends_with((char **)&local_58,(char *)ppVar21,"apos;"),
                   ppVar11 = local_58, !bVar9)) &&
                  ((bVar9 = ends_with((char **)&local_58,(char *)ppVar21,"#x27;"),
                   ppVar11 = local_58, !bVar9 &&
                   ((bVar9 = ends_with((char **)&local_58,(char *)ppVar21,"#X27;"),
                    ppVar11 = local_58, !bVar9 &&
                    (bVar9 = ends_with((char **)&local_58,(char *)ppVar21,"#39;"),
                    ppVar11 = local_58, !bVar9)))))))) goto LAB_00246c87;
            }
            else {
              if ((cVar2 == '<') || (cVar2 == '>')) goto LAB_00246c87;
              local_58 = (pointer)((long)&ppVar11->property_begin + 1);
              ppVar11 = local_58;
            }
          }
          (part->tag).properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].value_begin = (char *)ppVar12;
          (part->tag).properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].value_end = (char *)ppVar21;
          ppVar21 = (pointer)((long)&ppVar21->property_begin + 1);
          bVar9 = false;
        }
      }
    }
  }
  else {
    if (part->type != html_entity) {
      return;
    }
    pcVar4 = part->begin;
    pbVar18 = (byte *)(pcVar4 + 1);
    pbVar22 = (byte *)(part->end + -1);
    if (pbVar18 < pbVar22) {
      pbVar14 = pbVar18;
      if (*pbVar18 == 0x23) {
        local_58 = (pointer)0x0;
        part->type = html_numeric_entity;
        pbVar18 = (byte *)(pcVar4 + 2);
        if (pbVar18 != pbVar22) {
          pbVar14 = pbVar18;
          if ((*pbVar18 | 0x20) == 0x78) {
            pbVar18 = (byte *)(pcVar4 + 3);
            pbVar14 = pbVar18;
            if (pbVar18 != pbVar22) {
              for (; pbVar14 != pbVar22; pbVar14 = pbVar14 + 1) {
                if ((9 < (byte)(*pbVar14 - 0x30)) &&
                   ((uVar15 = *pbVar14 - 0x41, 0x25 < uVar15 ||
                    ((0x3f0000003fU >> ((ulong)uVar15 & 0x3f) & 1) == 0)))) goto LAB_00246c87;
              }
              __base = 0x10;
LAB_00246c30:
              uVar13 = strtol((char *)pbVar18,(char **)&local_58,__base);
              if (((local_58 != (pointer)0x0) &&
                  ((long)uVar13 < 0x110000 && *(char *)&local_58->property_begin == ';')) &&
                 (0x20 < uVar13 - 0x7f &&
                  ((uVar13 & 0xfffffffffffffffe) != 0xfffe &&
                  (uVar13 & 0xfffffffffffffc00) != 0xd800))) {
                if (0x1f < (long)uVar13) {
                  return;
                }
                if ((8 < (long)uVar13) && (uVar13 == 0xd || 0xfffffffffffffffd < uVar13 - 0xb)) {
                  return;
                }
              }
            }
          }
          else {
            do {
              if (pbVar14 == pbVar22) {
                __base = 10;
                goto LAB_00246c30;
              }
              bVar3 = *pbVar14;
              pbVar14 = pbVar14 + 1;
            } while ((byte)(bVar3 - 0x30) < 10);
          }
        }
      }
      else {
        do {
          if (pbVar14 == pbVar22) {
            (part->tag).tag_begin = (char *)pbVar18;
            (part->tag).tag_end = (char *)pbVar22;
            return;
          }
          bVar9 = ascii_isalnum(*pbVar14);
          pbVar14 = pbVar14 + 1;
        } while (bVar9);
      }
    }
  }
LAB_00246c87:
  part->type = invalid_data;
  return;
}

Assistant:

void parse_part(entry &part)
		{
			switch(part.type) {
			case html_entity:
				parse_html_entity(part);
				break;
			case html_tag:
				parse_html_tag(part);
				break;
			default:
				/* Nothing to do in other cases */ ;
			}
		}